

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

char * get_warned_of_monster(obj *otmp)

{
  artifact *local_28;
  artifact *arti;
  obj *otmp_local;
  
  if ((otmp != (obj *)0x0) && (otmp->oartifact != '\0')) {
    if ((otmp == (obj *)0x0) || (otmp->oartifact == '\0')) {
      local_28 = (artifact *)0x0;
    }
    else {
      local_28 = artilist + (int)otmp->oartifact;
    }
    if (((local_28->spfx & 0x8000000) != 0) && (local_28->mtype != 0)) {
      switch(local_28->mtype) {
      case 0x1e:
        otmp_local = (obj *)0x3697ab;
        return (char *)otmp_local;
      default:
        otmp_local = (obj *)0x3968d2;
        return (char *)otmp_local;
      case 0x24:
        otmp_local = (obj *)anon_var_dwarf_5ce3;
        return (char *)otmp_local;
      case 0x29:
        otmp_local = (obj *)anon_var_dwarf_5cd8;
        return (char *)otmp_local;
      case 0x2e:
        otmp_local = (obj *)anon_var_dwarf_5cb6;
        return (char *)otmp_local;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *get_warned_of_monster(const struct obj *otmp)
{
	if (otmp && otmp->oartifact) {
	    const struct artifact *arti = get_artifact(otmp);
	    if (arti->spfx & SPFX_WARN_S && arti->mtype) {
		switch (arti->mtype) {
		case S_TROLL: return "trolls"; break;
		case S_DRAGON: return "dragons"; break;
		case S_OGRE: return "ogres"; break;
		case S_JABBERWOCK: return "jabberwocks"; break;
		default: return "something"; break;
		}
	    }
	}

	return NULL;
}